

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Voice::tick(V2Voice *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    V2Env::tick((V2Env *)((long)&this->env[0].out + lVar1),this->gate);
    lVar1 = lVar1 + 0x24;
  } while (lVar1 == 0x24);
  lVar1 = 0;
  do {
    V2LFO::tick((V2LFO *)((long)&this->lfo[0].out + lVar1));
    lVar1 = lVar1 + 0x28;
  } while (lVar1 == 0x28);
  this->volramp = (this->env[0].out * 0.0078125 - this->curvol) * this->inst->SRfciframe;
  return;
}

Assistant:

void tick()
    {
        for (int i=0; i < syVV2::NENV; i++)
            env[i].tick(gate);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].tick();

        // volume ramping slope
        volramp = (env[0].out / 128.0f - curvol) * inst->SRfciframe;
        DEBUG_PLOT_VAL(&curvol, curvol);
    }